

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O2

bool __thiscall pstore::uuid::is_null(uuid *this)

{
  long lVar1;
  
  lVar1 = 0;
  while( true ) {
    if (lVar1 == 0x10) {
      return true;
    }
    if ((this->data_)._M_elems[lVar1] != '\0') break;
    if ((this->data_)._M_elems[lVar1 + 1] != '\0') {
      lVar1 = lVar1 + 1;
      break;
    }
    if ((this->data_)._M_elems[lVar1 + 2] != '\0') {
      lVar1 = lVar1 + 2;
      break;
    }
    if ((this->data_)._M_elems[lVar1 + 3] != '\0') {
      lVar1 = lVar1 + 3;
      break;
    }
    lVar1 = lVar1 + 4;
  }
  return lVar1 == 0x10;
}

Assistant:

bool uuid::is_null () const noexcept {
        return std::all_of (std::begin (data_), std::end (data_), [] (auto const v) { return !v; });
    }